

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.cc
# Opt level: O0

string * __thiscall
MD5::getFileChecksum_abi_cxx11_
          (string *__return_storage_ptr__,MD5 *this,char *filename,qpdf_offset_t up_to_offset)

{
  size_t n;
  MD5 *this_00;
  undefined1 local_30 [8];
  MD5 m;
  qpdf_offset_t up_to_offset_local;
  char *filename_local;
  
  m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)filename;
  MD5((MD5 *)local_30,(uchar *)this,(size_t)filename,(uchar *)up_to_offset);
  encodeFile((MD5 *)local_30,(char *)this,
             (qpdf_offset_t)
             m.crypto.super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi);
  this_00 = (MD5 *)local_30;
  unparse_abi_cxx11_(__return_storage_ptr__,this_00);
  ~MD5((MD5 *)local_30,(uchar *)this_00,n,(uchar *)up_to_offset);
  return __return_storage_ptr__;
}

Assistant:

std::string
MD5::getFileChecksum(char const* filename, qpdf_offset_t up_to_offset)
{
    MD5 m;
    m.encodeFile(filename, up_to_offset);
    return m.unparse();
}